

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::BufferVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::BufferVkImpl>::operator=
          (RefCntAutoPtr<Diligent::BufferVkImpl> *this,BufferVkImpl *pObj)

{
  BufferVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::BufferVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (BufferVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
      Release((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (BufferVkImpl *)0x0) {
      RefCountedObject<Diligent::IBufferVk>::AddRef
                ((RefCountedObject<Diligent::IBufferVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }